

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-select.c
# Opt level: O1

ssh_hash * sha512_select(ssh_hashalg *alg)

{
  char cVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 *puVar4;
  undefined1 uVar5;
  ssh_hash *unaff_RBX;
  ssh_hashalg *alg_1;
  undefined8 *puVar6;
  
  puVar6 = (undefined8 *)alg->extra;
  puVar2 = (undefined8 *)*puVar6;
  while (puVar2 != (undefined8 *)0x0) {
    puVar6 = puVar6 + 1;
    lVar3 = puVar2[10];
    if (**(char **)(lVar3 + 0x10) == '\0') {
      uVar5 = (**(code **)(lVar3 + 8))();
      puVar4 = *(undefined1 **)(lVar3 + 0x10);
      puVar4[1] = uVar5;
      *puVar4 = 1;
    }
    cVar1 = *(char *)(*(long *)(lVar3 + 0x10) + 1);
    if ((cVar1 == '\x01') &&
       (unaff_RBX = (ssh_hash *)(*(code *)*puVar2)(puVar2), unaff_RBX != (ssh_hash *)0x0)) {
      (*unaff_RBX->vt->reset)(unaff_RBX);
    }
    if (cVar1 != '\0') break;
    puVar2 = (undefined8 *)*puVar6;
  }
  if (puVar2 != (undefined8 *)0x0) {
    return unaff_RBX;
  }
  __assert_fail("false && \"sha512_select ran off the end of its list\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha512-select.c"
                ,0x2c,"ssh_hash *sha512_select(const ssh_hashalg *)");
}

Assistant:

static ssh_hash *sha512_select(const ssh_hashalg *alg)
{
    const ssh_hashalg *const *real_algs =
        (const ssh_hashalg *const *)alg->extra;

    for (size_t i = 0; real_algs[i]; i++) {
        const ssh_hashalg *alg = real_algs[i];
        const struct sha512_extra *alg_extra =
            (const struct sha512_extra *)alg->extra;
        if (check_availability(alg_extra))
            return ssh_hash_new(alg);
    }

    /* We should never reach the NULL at the end of the list, because
     * the last non-NULL entry should be software-only SHA-512, which
     * is always available. */
    unreachable("sha512_select ran off the end of its list");
}